

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_no_run_on_unref(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  uv_handle_t *handle;
  long *plVar3;
  char *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer_handle;
  long lStack_a8;
  uv_loop_t *puStack_a0;
  void *local_90;
  undefined1 local_88 [8];
  uv_timer_t local_80;
  
  puStack_a0 = (uv_loop_t *)0x1d41e4;
  puVar2 = uv_default_loop();
  puStack_a0 = (uv_loop_t *)0x1d41f1;
  iVar1 = uv_timer_init(puVar2,(uv_timer_t *)(local_88 + 8));
  local_88 = (undefined1  [8])(long)iVar1;
  local_90 = (void *)0x0;
  if (local_88 == (undefined1  [8])0x0) {
    puStack_a0 = (uv_loop_t *)0x1d4226;
    iVar1 = uv_timer_start((uv_timer_t *)(local_88 + 8),abort,0,0);
    local_88 = (undefined1  [8])(long)iVar1;
    local_90 = (void *)0x0;
    if (local_88 != (undefined1  [8])0x0) goto LAB_001d42e6;
    puStack_a0 = (uv_loop_t *)0x1d4250;
    uv_unref((uv_handle_t *)(local_88 + 8));
    puStack_a0 = (uv_loop_t *)0x1d4255;
    puVar2 = uv_default_loop();
    puStack_a0 = (uv_loop_t *)0x1d425f;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_88 = (undefined1  [8])(long)iVar1;
    local_90 = (void *)0x0;
    if (local_88 == (undefined1  [8])0x0) {
      puStack_a0 = (uv_loop_t *)0x1d4280;
      unaff_RBX = uv_default_loop();
      puStack_a0 = (uv_loop_t *)0x1d4294;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      puStack_a0 = (uv_loop_t *)0x1d429e;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      local_88 = (undefined1  [8])0x0;
      puStack_a0 = (uv_loop_t *)0x1d42ac;
      puVar2 = uv_default_loop();
      puStack_a0 = (uv_loop_t *)0x1d42b4;
      iVar1 = uv_loop_close(puVar2);
      local_90 = (void *)(long)iVar1;
      if (local_88 == (undefined1  [8])local_90) {
        puStack_a0 = (uv_loop_t *)0x1d42cc;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d4304;
    }
  }
  else {
    puStack_a0 = (uv_loop_t *)0x1d42e6;
    run_test_timer_no_run_on_unref_cold_1();
LAB_001d42e6:
    puStack_a0 = (uv_loop_t *)0x1d42f5;
    run_test_timer_no_run_on_unref_cold_2();
  }
  puStack_a0 = (uv_loop_t *)0x1d4304;
  run_test_timer_no_run_on_unref_cold_3();
LAB_001d4304:
  handle = (uv_handle_t *)local_88;
  puStack_a0 = (uv_loop_t *)once_close_cb;
  run_test_timer_no_run_on_unref_cold_4();
  puStack_a0 = unaff_RBX;
  puts("ONCE_CLOSE_CB");
  if (handle == (uv_handle_t *)0x0) {
    once_close_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active(handle);
    lStack_a8 = (long)iVar1;
    if (lStack_a8 == 0) {
      once_close_cb_called = once_close_cb_called + 1;
      return iVar1;
    }
  }
  plVar3 = &lStack_a8;
  once_close_cb_cold_1();
  handle_00 = "REPEAT_CLOSE_CB";
  iVar1 = puts("REPEAT_CLOSE_CB");
  if (plVar3 != (long *)0x0) {
    repeat_close_cb_called = repeat_close_cb_called + 1;
    return iVar1;
  }
  repeat_close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle_00);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle_00,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(timer_no_run_on_unref) {
  uv_timer_t timer_handle;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle, (uv_timer_cb) abort, 0, 0));
  uv_unref((uv_handle_t*) &timer_handle);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}